

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

char * CVmObjBigNum::cache_ln10(size_t prec)

{
  ushort *dst;
  CVmBigNumCache *pCVar1;
  err_frame_t *peVar2;
  CVmException *pCVar3;
  uint16_t tmp;
  int iVar4;
  ulong uVar5;
  long *in_FS_OFFSET;
  char *ext1;
  char *ext2;
  uint hdl5;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  char *ext5;
  char *ext4;
  char *ext3;
  err_frame_t err_cur__;
  
  pCVar1 = S_bignum_cache;
  iVar4 = CVmBigNumCacheReg::alloc_mem(&S_bignum_cache->ln10_,(prec + 7 >> 3) * 4 + 5);
  dst = (ushort *)(pCVar1->ln10_).buf_;
  if (dst != (ushort *)0x0) {
    uVar5 = prec + 7 & 0xfffffffffffffff8;
    if ((iVar4 != 0) || (*dst < uVar5)) {
      *dst = (ushort)uVar5;
      alloc_temp_regs(uVar5 | 3,5,&ext1,&hdl1,&ext2,&hdl2,&ext3,&hdl3,&ext4,&hdl4,&ext5,&hdl5);
      G_err_frame::__tls_init();
      err_cur__.prv_ = (err_frame_t *)*in_FS_OFFSET;
      G_err_frame::__tls_init();
      *in_FS_OFFSET = (long)&err_cur__;
      err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
      if (err_cur__.state_ == 0) {
        copy_val(ext2,(char *)"\x01",0);
        compute_sqrt_into(ext1,ext2);
        ext1 = compute_ln_series_into(ext1,ext2,ext3,ext4,ext5);
        mul_by_long(ext1,2);
        copy_val((char *)dst,ext1,1);
      }
      if (-1 < (short)err_cur__.state_) {
        err_cur__.state_ = err_cur__.state_ | 0x8000;
        release_temp_regs(5,(ulong)hdl1,(ulong)hdl2,(ulong)hdl3,(ulong)hdl4,(ulong)hdl5);
      }
      peVar2 = err_cur__.prv_;
      G_err_frame::__tls_init();
      *in_FS_OFFSET = (long)peVar2;
      if ((err_cur__.state_ & 0x4001U) != 0) {
        G_err_frame::__tls_init();
        if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
          G_err_frame::__tls_init();
          free(*(void **)(*in_FS_OFFSET + 0x10));
        }
        pCVar3 = err_cur__.exc_;
        G_err_frame::__tls_init();
        *(CVmException **)(*in_FS_OFFSET + 0x10) = pCVar3;
        err_rethrow();
      }
      if ((err_cur__.state_ & 2U) != 0) {
        free(err_cur__.exc_);
      }
    }
    return (char *)dst;
  }
  err_throw(0xca);
}

Assistant:

const char *CVmObjBigNum::cache_ln10(size_t prec)
{
    char *ext;
    int expanded;
    uint hdl1, hdl2, hdl3, hdl4, hdl5;
    char *ext1, *ext2, *ext3, *ext4, *ext5;
    static const unsigned char ten[] =
    {
        /* number of digits */
        0x01, 0x00,

        /* exponent (0.1 * 10^2 = 10) */
        0x02, 0x00,

        /* flags */
        0x00,

        /* mantissa */
        0x10
    };

    /* 
     *   round up the precision a bit to ensure that we don't have to
     *   repeatedly recalculate this value if we're asked for a cluster of
     *   similar precisions 
     */
    prec = (prec + 7) & ~7;
    
    /* get the ln10 cache register */
    ext = S_bignum_cache->get_ln10_reg(calc_alloc(prec), &expanded);

    /* if that failed, throw an error */
    if (ext == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* 
     *   if we didn't have to allocate more memory, and the value in the
     *   register has at least the required precision, return the cached
     *   value 
     */
    if (!expanded && get_prec(ext) >= prec)
        return ext;

    /* 
     *   we have reallocated the register, or we just didn't have enough
     *   precision in the old value - set the new precision 
     */
    set_prec(ext, prec);

    /* allocate some temporary registers */
    alloc_temp_regs(prec + 3, 5,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4, &ext5, &hdl5);

    /* catch errors so we can be sure to free registers */
    err_try
    {
        /* 
         *   Compute sqrt(10) - 10 is too large for the series to converge,
         *   but sqrt(10) is good.  We'll correct for this later by doubling
         *   the result of the series expansion, which gives us the correct
         *   result: ln(a^b) = b*ln(a), and sqrt(x) = x^(1/2), hence
         *   ln(sqrt(x)) = ln(x)/2, which means that ln(x) = 2*ln(sqrt(x)).
         *   
         *   Note that we have to do this the hard way, by explicitly doing
         *   the ln series rather than just calling compute_ln_into() to get
         *   the value directly.  Why?  Because compute_ln_into() needs the
         *   cached value of ln(10) to do its work.  If we called
         *   compute_ln_into() here, we'd get stuck in a recursion loop.  
         */

        /* compute sqrt(10), for quick series convergence */
        copy_val(ext2, (const char *)ten, FALSE);
        compute_sqrt_into(ext1, ext2);

        /* compute the series expansion */
        ext1 = compute_ln_series_into(ext1, ext2, ext3, ext4, ext5);

        /* double the result (to adjust for the sqrt) */
        mul_by_long(ext1, 2);

        /* store the result in the cache */
        copy_val(ext, ext1, TRUE);
    }